

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void google::protobuf::FileDescriptorTables::BuildLocationsByPath
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                *p)

{
  int iVar1;
  FileDescriptorTables *pFVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar3;
  int index;
  char *in_R8;
  string_view separator;
  string local_68;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>::iterator,_bool>
  local_48;
  
  iVar1 = *(int *)((long)&p->second->field_0 + 0x20);
  if (0 < iVar1) {
    index = 0;
    do {
      pVVar3 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                         (&(p->second->field_0)._impl_.location_.super_RepeatedPtrFieldBase,index);
      pFVar2 = p->first;
      separator._M_str = in_R8;
      separator._M_len = (size_t)",";
      absl::lts_20250127::strings_internal::JoinRange<google::protobuf::RepeatedField<int>>
                (&local_68,(strings_internal *)&(pVVar3->field_0)._impl_.path_,
                 (RepeatedField<int> *)0x1,separator);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
      ::try_emplace_impl<std::__cxx11::string>(&local_48,&pFVar2->locations_by_path_,&local_68);
      *(Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
        **)((long)local_48.first.field_1.slot_ + 0x20) = pVVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
    } while (iVar1 != index);
  }
  return;
}

Assistant:

void FileDescriptorTables::BuildLocationsByPath(
    std::pair<const FileDescriptorTables*, const SourceCodeInfo*>* p) {
  for (int i = 0, len = p->second->location_size(); i < len; ++i) {
    const SourceCodeInfo_Location* loc = &p->second->location().Get(i);
    p->first->locations_by_path_[absl::StrJoin(loc->path(), ",")] = loc;
  }
}